

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.hpp
# Opt level: O0

API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
* __thiscall
Args::details::
API<Args::CmdLine,Args::Command,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,false>
::addArgWithNameOnly<char_const(&)[6]>
          (API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
           *this,char (*name) [6],bool isWithValue,bool isRequired,String *desc,String *longDesc,
          String *defaultValue,String *valueSpecifier)

{
  ulong uVar1;
  pointer pAVar2;
  API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
  *in_RDI;
  undefined8 in_stack_00000008;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> a;
  unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> arg;
  pointer in_stack_ffffffffffffff68;
  Arg *in_stack_ffffffffffffff70;
  unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> *this_00;
  unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> *in_stack_ffffffffffffff78;
  Command *pCVar3;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *in_stack_ffffffffffffff80;
  undefined1 *puVar4;
  undefined1 local_68 [30];
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  char (*in_stack_ffffffffffffffb8) [6];
  Arg *in_stack_ffffffffffffffc0;
  
  operator_new(0xf8);
  Arg::Arg<char_const(&)[6]>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7,
             (bool)in_stack_ffffffffffffffb6);
  Deleter<Args::ArgIface>::Deleter((Deleter<Args::ArgIface> *)&stack0xffffffffffffffbb,true);
  std::unique_ptr<Args::Arg,Args::details::Deleter<Args::ArgIface>>::
  unique_ptr<Args::details::Deleter<Args::ArgIface>,void>
            ((unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> *)
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             (__enable_if_t<_is_lvalue_reference<Deleter<ArgIface>_>::value,_Args::details::Deleter<Args::ArgIface>_&&>
              )0x176992);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_>::operator->
              ((unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> *)0x1769aa);
    Arg::setDescription(in_stack_ffffffffffffff70,(String *)in_stack_ffffffffffffff68);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_>::operator->
              ((unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> *)0x176a08);
    Arg::setLongDescription(in_stack_ffffffffffffff70,(String *)in_stack_ffffffffffffff68);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pAVar2 = std::unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_>::operator->
                       ((unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> *)0x176a34);
    (*(pAVar2->super_ArgIface)._vptr_ArgIface[0x16])(pAVar2,in_stack_00000008);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_>::operator->
              ((unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> *)0x176a6a);
    Arg::setValueSpecifier(in_stack_ffffffffffffff70,(String *)in_stack_ffffffffffffff68);
  }
  this_00 = (unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> *)(local_68 + 0x10);
  std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>::
  unique_ptr<Args::Arg,Args::details::Deleter<Args::ArgIface>,void>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pCVar3 = in_RDI->m_self;
  puVar4 = local_68;
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::unique_ptr
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)this_00,
             (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
             in_stack_ffffffffffffff68);
  (*(pCVar3->super_GroupIface).super_ArgIface._vptr_ArgIface[0x13])(pCVar3,puVar4);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)this_00);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)this_00);
  std::unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr(this_00);
  return in_RDI;
}

Assistant:

API< PARENT, Command, ARGPTR, false > & addArgWithNameOnly(
		//! Name for this argument.
		NAME && name,
		//! Is this argument with value?
		bool isWithValue = false,
		//! Is this argument required?
		bool isRequired = false,
		//! Description of the argument.
		const String & desc = String(),
		//! Long description.
		const String & longDesc = String(),
		//! Default value.
		const String & defaultValue = String(),
		//! Value specifier.
		const String & valueSpecifier = String() )
	{

		auto arg = std::unique_ptr< Arg, details::Deleter< ArgIface > > (
			new Arg( std::forward< NAME > ( name ), isWithValue,
				isRequired ),
			details::Deleter< ArgIface > ( true ) );

		if( !desc.empty() )
			arg->setDescription( desc );

		if( !longDesc.empty() )
			arg->setLongDescription( longDesc );

		if( !defaultValue.empty() )
			arg->setDefaultValue( defaultValue );

		if( !valueSpecifier.empty() )
			arg->setValueSpecifier( valueSpecifier );

		ARGPTR a = std::move( arg );

		m_self.addArg( std::move( a ) );

		return *this;
	}